

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O1

bool __thiscall
JitFFI::SysV64::ArgOPList::do_next
          (ArgOPList *this,function<void_(JitFFI::SysV64::ArgTypeInfo::OP,_unsigned_int)> *f)

{
  bool bVar1;
  Data data;
  OP local_21;
  uint local_20;
  Data local_1c;
  
  bVar1 = StackList<JitFFI::SysV64::ArgOPList::Data>::get_next(&this->datalist,&local_1c);
  if (bVar1) {
    local_21 = local_1c.op;
    local_20 = local_1c.num;
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*f->_M_invoker)((_Any_data *)f,&local_21,&local_20);
  }
  return bVar1;
}

Assistant:

bool do_next(const std::function<void(ArgTypeInfo::OP, unsigned int num)> &f) {
				Data data;
				bool v = datalist.get_next(data);
				if (v == false)
					return false;
				f(data.op, data.num);
				return true;
			}